

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

int Llb_ManCutVolume_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  iVar1 = p->nTravIds;
  iVar2 = 0;
  if (pObj->TravId != iVar1) {
    iVar2 = 0;
    do {
      pObj->TravId = iVar1;
      if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                      ,0x136,"int Llb_ManCutVolume_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      iVar1 = Llb_ManCutVolume_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar2 = iVar2 + iVar1 + 1;
      iVar1 = p->nTravIds;
    } while (pObj->TravId != iVar1);
  }
  return iVar2;
}

Assistant:

int Llb_ManCutVolume_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Aig_ObjSetTravIdCurrent(p, pObj);
    assert( Aig_ObjIsNode(pObj) );
    return 1 + Llb_ManCutVolume_rec(p, Aig_ObjFanin0(pObj)) + 
        Llb_ManCutVolume_rec(p, Aig_ObjFanin1(pObj));
}